

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_add_golas_heart.cpp
# Opt level: O3

MapPalette * build_greyscale_palette(World *world,MapPalette *palette,float luminance)

{
  uint8_t r;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  MapPalette *palette_00;
  size_t i;
  long lVar6;
  float fVar7;
  float fVar8;
  Color local_2c;
  
  palette_00 = (MapPalette *)operator_new(0x34);
  uVar1 = *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 2);
  uVar2 = *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 4);
  uVar3 = *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 6);
  uVar4 = *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 8);
  uVar5 = *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 10);
  *(undefined8 *)(palette_00->super_array<Color,_13UL>)._M_elems =
       *(undefined8 *)(palette->super_array<Color,_13UL>)._M_elems;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 2) = uVar1;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 4) = uVar2;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 6) = uVar3;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 8) = uVar4;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 10) = uVar5;
  (palette_00->super_array<Color,_13UL>)._M_elems[0xc] =
       (palette->super_array<Color,_13UL>)._M_elems[0xc];
  lVar6 = 0;
  do {
    fVar7 = (float)(((uint)(palette_00->super_array<Color,_13UL>)._M_elems[lVar6]._b +
                    (uint)(palette_00->super_array<Color,_13UL>)._M_elems[lVar6]._g +
                    (uint)(palette_00->super_array<Color,_13UL>)._M_elems[lVar6]._r) / 3 & 0xff) *
            luminance;
    fVar8 = 255.0;
    if (fVar7 <= 255.0) {
      fVar8 = fVar7;
    }
    r = (uint8_t)(int)fVar8;
    Color::Color(&local_2c,r,r,r);
    (palette_00->super_array<Color,_13UL>)._M_elems[lVar6] = local_2c;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xd);
  World::add_map_palette(world,palette_00);
  return palette_00;
}

Assistant:

static MapPalette* build_greyscale_palette(World& world, MapPalette* palette, float luminance = 1.f)
{
    MapPalette* pal = new MapPalette(*palette);
    for(size_t i=0 ; i<pal->size() ; ++i)
    {
        uint8_t average = (pal->at(i).r() + pal->at(i).g() + pal->at(i).b()) / 3;
        average = (uint8_t)std::min((float)average * luminance, 255.f);
        (*pal)[i] = { average, average, average };
    }

//    Color color_red = Color(0xC0, 0x00, 0x00);
//
//    MapPalette* pal = new MapPalette({
//            color_red, color_red, color_red, color_red, color_red, color_red, color_red,
//            color_red, color_red, color_red, color_red, color_red, color_red
//    });

    world.add_map_palette(pal);
    return pal;
}